

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O0

bool ptc::Print<char>::is_escape<char[13]>(char (*str) [13],ANSI *flag)

{
  size_type sVar1;
  size_type sVar2;
  bool local_45;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  ANSI *local_20;
  ANSI *flag_local;
  char (*str_local) [13];
  
  local_20 = flag;
  flag_local = (ANSI *)str;
  if (*flag == first) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_30,*str);
    sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::length(&local_30);
    local_45 = false;
    if (sVar1 < 7) {
      local_45 = (char)*flag_local == 0x1b;
    }
    str_local._7_1_ = local_45;
  }
  else if (*flag == generic) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_40,*str);
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find(&local_40,'\x1b',0);
    str_local._7_1_ = sVar2 != 0xffffffffffffffff;
  }
  else {
    str_local._7_1_ = false;
  }
  return str_local._7_1_;
}

Assistant:

static constexpr bool is_escape( const T& str, const ANSI& flag )
     {
      if constexpr( std::is_convertible_v <T, std::basic_string_view<T_str>> && ! std::is_same_v<T, std::nullptr_t> )
       {
        switch( flag )
         {
          case( ANSI::first ): 
           {
            return ( std::basic_string_view<T_str>( str ).length() < 7 ) && ( str[0] == '\033' );
           }
          case( ANSI::generic ):
           {
            return ( std::basic_string_view<T_str>( str ).find( '\033' ) != std::basic_string_view<T_str>::npos );
           }
         }
       }
      return false;
     }